

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

AnyCellmlElementPtr __thiscall
libcellml::Annotator::AnnotatorImpl::convertToShared(AnnotatorImpl *this,AnyCellmlElementPtr *item)

{
  CellmlElementType type;
  CellmlElementType CVar1;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  weak_ptr<libcellml::Component> wVar2;
  weak_ptr<libcellml::Model> wVar3;
  weak_ptr<libcellml::Units> wVar4;
  weak_ptr<libcellml::ImportSource> wVar5;
  weak_ptr<libcellml::Reset> wVar6;
  weak_ptr<libcellml::Variable> wVar7;
  AnyCellmlElementPtr AVar8;
  any aStack_c8;
  __shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> local_b8;
  ResetPtr reset;
  VariablePairPtr variablePair;
  VariablePtr variable;
  UnitsItemPtr unitsItem;
  UnitsPtr units;
  ModelPtr model;
  ImportSourcePtr importSource;
  ComponentPtr component;
  
  AnyCellmlElement::AnyCellmlElementImpl::create();
  type = AnyCellmlElement::type((AnyCellmlElement *)*in_RDX);
  component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  reset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  reset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  variablePair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  variablePair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CVar1 = AnyCellmlElement::type((AnyCellmlElement *)*in_RDX);
  switch(CVar1) {
  case COMPONENT:
  case COMPONENT_REF:
    wVar2 = std::any_cast<std::weak_ptr<libcellml::Component>>(&aStack_c8);
    std::__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b8,&aStack_c8,
               wVar2.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    std::__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>,
               &local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_c8._M_storage);
    AnyCellmlElement::AnyCellmlElementImpl::setComponent
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,
               (ComponentPtr *)
               &component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>,type)
    ;
    break;
  case CONNECTION:
  case MAP_VARIABLES:
    AnyCellmlElement::variablePair((AnyCellmlElement *)&local_b8);
    std::__shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&variablePair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
               ,(__shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    AnyCellmlElement::AnyCellmlElementImpl::setVariablePair
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,
               (VariablePairPtr *)
               &variablePair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
               ,type);
    break;
  case ENCAPSULATION:
  case MODEL:
    wVar3 = std::any_cast<std::weak_ptr<libcellml::Model>>(&aStack_c8);
    std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)&local_b8,&aStack_c8,
               wVar3.super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_c8._M_storage);
    AnyCellmlElement::AnyCellmlElementImpl::setModel
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,
               (ModelPtr *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>,
               type);
    break;
  case IMPORT:
    wVar5 = std::any_cast<std::weak_ptr<libcellml::ImportSource>>(&aStack_c8);
    std::__shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2> *)&local_b8,
               &aStack_c8,
               wVar5.super___weak_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    std::__shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
               ,(__shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_c8._M_storage);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,
               (ImportSourcePtr *)
               &importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
              );
    break;
  default:
    wVar7 = std::any_cast<std::weak_ptr<libcellml::Variable>>(&aStack_c8);
    std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)&local_b8,&aStack_c8
               ,wVar7.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._M_pi);
    std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_c8._M_storage);
    AnyCellmlElement::AnyCellmlElementImpl::setVariable
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,
               (VariablePtr *)
               &variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
    break;
  case RESET:
    wVar6 = std::any_cast<std::weak_ptr<libcellml::Reset>>(&aStack_c8);
    std::__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2> *)&local_b8,&aStack_c8,
               wVar6.super___weak_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    std::__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&reset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_c8._M_storage);
    AnyCellmlElement::AnyCellmlElementImpl::setReset
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,
               (ResetPtr *)&reset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>,
               RESET);
    break;
  case RESET_VALUE:
    wVar6 = std::any_cast<std::weak_ptr<libcellml::Reset>>(&aStack_c8);
    std::__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2> *)&local_b8,&aStack_c8,
               wVar6.super___weak_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    std::__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&reset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_c8._M_storage);
    AnyCellmlElement::AnyCellmlElementImpl::setResetValue
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,
               (ResetPtr *)&reset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>);
    break;
  case TEST_VALUE:
    wVar6 = std::any_cast<std::weak_ptr<libcellml::Reset>>(&aStack_c8);
    std::__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2> *)&local_b8,&aStack_c8,
               wVar6.super___weak_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    std::__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&reset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_c8._M_storage);
    AnyCellmlElement::AnyCellmlElementImpl::setTestValue
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,
               (ResetPtr *)&reset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>);
    break;
  case UNIT:
    AnyCellmlElement::unitsItem((AnyCellmlElement *)&local_b8);
    std::__shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    AnyCellmlElement::AnyCellmlElementImpl::setUnitsItem
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,
               (UnitsItemPtr *)
               &unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>);
    break;
  case UNITS:
    wVar4 = std::any_cast<std::weak_ptr<libcellml::Units>>(&aStack_c8);
    std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)&local_b8,&aStack_c8,
               wVar4.super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_c8._M_storage);
    AnyCellmlElement::AnyCellmlElementImpl::setUnits
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,
               (UnitsPtr *)&units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&variablePair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&reset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  AVar8.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  AVar8.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnyCellmlElementPtr)
         AVar8.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnyCellmlElementPtr Annotator::AnnotatorImpl::convertToShared(const AnyCellmlElementPtr &item)
{
    auto converted = AnyCellmlElement::AnyCellmlElementImpl::create();
    auto type = item->type();

    ComponentPtr component;
    ImportSourcePtr importSource;
    ModelPtr model;
    ResetPtr reset;
    UnitsPtr units;
    UnitsItemPtr unitsItem;
    VariablePtr variable;
    VariablePairPtr variablePair;

    switch (item->type()) {
    case CellmlElementType::COMPONENT:
    case CellmlElementType::COMPONENT_REF:
        component = std::any_cast<ComponentWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setComponent(component, type);
        break;
    case CellmlElementType::CONNECTION:
    case CellmlElementType::MAP_VARIABLES:
        variablePair = item->variablePair();
        converted->mPimpl->setVariablePair(variablePair, type);
        break;
    case CellmlElementType::ENCAPSULATION:
    case CellmlElementType::MODEL:
        model = std::any_cast<ModelWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setModel(model, type);
        break;
    case CellmlElementType::IMPORT:
        importSource = std::any_cast<ImportSourceWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setImportSource(importSource);
        break;
    case CellmlElementType::RESET:
        reset = std::any_cast<ResetWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setReset(reset);
        break;
    case CellmlElementType::RESET_VALUE:
        reset = std::any_cast<ResetWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setResetValue(reset);
        break;
    case CellmlElementType::TEST_VALUE:
        reset = std::any_cast<ResetWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setTestValue(reset);
        break;
    case CellmlElementType::UNIT:
        unitsItem = item->unitsItem();
        converted->mPimpl->setUnitsItem(unitsItem);
        break;
    case CellmlElementType::UNITS:
        units = std::any_cast<UnitsWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setUnits(units);
        break;
    default: /* CellmlElementType::VARIABLE */
        variable = std::any_cast<VariableWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setVariable(variable);
        break;
    }

    return converted;
}